

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double pareto_cdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (a <= x) {
    dVar1 = pow(a / x,b);
    dVar1 = 1.0 - dVar1;
  }
  return dVar1;
}

Assistant:

double pareto_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    PARETO_CDF evaluates the Pareto CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double PARETO_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x < a )
  {
    cdf = 0.0;
  }
  else
  {
    cdf = 1.0 - pow ( ( a / x ), b );
  }

  return cdf;
}